

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

bool __thiscall wabt::anon_unknown_26::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  Enum EVar1;
  
  EVar1 = type.enum_;
  if (EVar1 < V128) {
    if ((uint)(EVar1 + 0x11) < 2) {
      return (bool)*(undefined1 *)((long)&(this->state_).data + 2);
    }
    if (EVar1 == ExnRef) {
      return (bool)(char)this->read_end_;
    }
    if (EVar1 == Reference) {
      return (bool)*(undefined1 *)((long)&this->read_end_ + 6);
    }
  }
  else {
    if ((uint)(EVar1 + I8U) < 4) {
      return true;
    }
    if (EVar1 == V128) {
      return (bool)*(undefined1 *)((long)&this->read_end_ + 4);
    }
  }
  return false;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::FuncRef:
    case Type::ExternRef:
      return options_.features.reference_types_enabled();

    case Type::ExnRef:
      return options_.features.exceptions_enabled();

    case Type::Reference:
      return options_.features.function_references_enabled();

    default:
      return false;
  }
}